

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall fasttext::Model::computeOutputSigmoid(Model *this,Vector *hidden,Vector *output)

{
  int iVar1;
  pointer pfVar2;
  int32_t i;
  long lVar3;
  real rVar4;
  
  computeOutput(this,hidden,output);
  iVar1 = this->osz_;
  pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    rVar4 = sigmoid(this,pfVar2[lVar3]);
    pfVar2[lVar3] = rVar4;
  }
  return;
}

Assistant:

void Model::computeOutputSigmoid(Vector& hidden, Vector& output) const {
	computeOutput(hidden, output);
	for (int32_t i = 0; i < osz_; i++) {
		output[i] = sigmoid(output[i]);
	}
}